

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O2

void __thiscall AtomicHash::AtomicHash(AtomicHash *this)

{
  int i;
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    LOCK();
    this->hash[lVar1].super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
  }
  return;
}

Assistant:

AtomicHash() {
		for (int i = 0; i < 4; ++i)
			hash[i].store(0);
	}